

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::ResetThreadId(Recycler *this)

{
  HeapInfoManager::ResetThreadId(&this->autoHeap);
  if (((this->enableConcurrentMark != false) || (this->enableParallelMark != false)) ||
     (this->enableConcurrentSweep != false)) {
    (((this->markContext).pagePool)->pageAllocator).concurrentThreadId = 0xffffffff;
  }
  (this->backgroundProfilerPageAllocator).concurrentThreadId = 0xffffffff;
  return;
}

Assistant:

void
Recycler::ResetThreadId()
{
    autoHeap.ResetThreadId();
#if ENABLE_CONCURRENT_GC
    if (this->IsConcurrentEnabled())
    {
        markContext.GetPageAllocator()->ClearConcurrentThreadId();
    }
#endif
#if defined(DBG) && defined(PROFILE_EXEC)
    this->backgroundProfilerPageAllocator.ClearConcurrentThreadId();
#endif
}